

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall GraphBuilder::getCorrespondingForks(GraphBuilder *this,CallInst *callInst)

{
  bool bVar1;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::CallInst_*>,_bool> pVar2;
  ForkNode *fork;
  iterator __end2;
  iterator __begin2;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *__range2;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> forks;
  const_iterator iterator;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *llvmForks;
  JoinNode *in_stack_ffffffffffffff48;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *this_00;
  _Rb_tree_const_iterator<const_llvm::CallInst_*> in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  _Self local_78;
  _Self local_70;
  undefined1 *local_68;
  undefined1 local_60 [48];
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  std::
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
         *)0x193bd6);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::find((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x193bef);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::end((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::__detail::
    _Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
                *)0x193c3b);
    JoinNode::correspondingForks(in_stack_ffffffffffffff48);
    local_68 = local_60;
    local_70._M_node =
         (_Base_ptr)
         std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::begin
                   ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)
                    in_stack_ffffffffffffff48);
    local_78._M_node =
         (_Base_ptr)
         std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::end
                   ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)
                    in_stack_ffffffffffffff48);
    while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
      std::_Rb_tree_const_iterator<ForkNode_*>::operator*
                ((_Rb_tree_const_iterator<ForkNode_*> *)0x193c90);
      Node::callInstruction(&in_stack_ffffffffffffff48->super_Node);
      pVar2 = std::
              set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
              ::insert((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
                        *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                       (value_type *)in_stack_ffffffffffffff68._M_node);
      in_stack_ffffffffffffff68 = pVar2.first._M_node;
      in_stack_ffffffffffffff70 = pVar2.second;
      std::_Rb_tree_const_iterator<ForkNode_*>::operator++
                ((_Rb_tree_const_iterator<ForkNode_*> *)this_00);
    }
    std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::~set
              ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)0x193cd5);
  }
  return in_RDI;
}

Assistant:

std::set<const CallInst *>
GraphBuilder::getCorrespondingForks(const CallInst *callInst) const {
    std::set<const CallInst *> llvmForks;
    auto iterator = llvmToJoins_.find(callInst);
    if (iterator != llvmToJoins_.end()) {
        auto forks = iterator->second->correspondingForks();
        for (auto *fork : forks) {
            llvmForks.insert(fork->callInstruction());
        }
    }
    return llvmForks;
}